

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDataSegmentData
          (BinaryReaderIR *this,Index index,void *data,Address size)

{
  pointer ppDVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  
  ppDVar1 = (this->module_->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3) - 1U == (ulong)index) {
    this_00 = &ppDVar1[index]->data;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,size);
    if (size != 0) {
      memcpy((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,data,size);
    }
    return (Result)Ok;
  }
  __assert_fail("index == module_->data_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x5c9,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnDataSegmentData(Index, const void *, Address)"
               );
}

Assistant:

Result BinaryReaderIR::OnDataSegmentData(Index index,
                                         const void* data,
                                         Address size) {
  assert(index == module_->data_segments.size() - 1);
  DataSegment* segment = module_->data_segments[index];
  segment->data.resize(size);
  if (size > 0) {
    memcpy(segment->data.data(), data, size);
  }
  return Result::Ok;
}